

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void calculate_next_timer_intr(Emulator *e)

{
  Ticks TVar1;
  Bool BVar2;
  u8 local_23;
  u16 local_22;
  u16 old_div_counter;
  u8 tima;
  u16 div_counter;
  Ticks cpu_tick;
  Ticks ticks;
  Emulator *e_local;
  
  if ((e->state).timer.on == FALSE) {
    (e->state).timer.next_intr_ticks = 0xffffffffffffffff;
  }
  else {
    cpu_tick = (e->state).timer.sync_ticks;
    TVar1 = (e->state).cpu_tick;
    local_22 = (e->state).timer.div_counter;
    local_23 = (e->state).timer.tima;
    if ((e->state).timer.tima_state == TIMA_STATE_OVERFLOW) {
      local_23 = (e->state).timer.tma;
      local_22 = local_22 + 4;
      cpu_tick = TVar1 + cpu_tick;
    }
    while( true ) {
      BVar2 = is_div_falling_edge(e,local_22,local_22 + 4);
      if ((BVar2 != FALSE) && (local_23 = local_23 + '\x01', local_23 == '\0')) break;
      cpu_tick = TVar1 + cpu_tick;
      local_22 = local_22 + 4;
    }
    (e->state).timer.next_intr_ticks = cpu_tick;
  }
  calculate_next_intr(e);
  return;
}

Assistant:

static void calculate_next_timer_intr(Emulator* e) {
  if (TIMER.on) {
    Ticks ticks = TIMER.sync_ticks;
    Ticks cpu_tick = e->state.cpu_tick;
    u16 div_counter = TIMER.div_counter;
    u8 tima = TIMER.tima;
    if (TIMER.tima_state == TIMA_STATE_OVERFLOW) {
      tima = TIMER.tma;
      div_counter += CPU_TICK;
      ticks += cpu_tick;
    }

    while (1) {
      u16 old_div_counter = div_counter;
      div_counter += CPU_TICK;
      if (is_div_falling_edge(e, old_div_counter, div_counter) && ++tima == 0) {
        break;
      }
      ticks += cpu_tick;
    }
    TIMER.next_intr_ticks = ticks;
  } else {
    TIMER.next_intr_ticks = INVALID_TICKS;
  }
  calculate_next_intr(e);
}